

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

int __thiscall
CVmObjGramProd::getp_get_gram_info
          (CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_val_t *pvVar3;
  vm_gram_ext *pvVar4;
  vm_val_t *in_RDX;
  CVmObjGramProd *in_RDI;
  vm_val_t val;
  size_t k;
  vm_prop_id_t *pp;
  CVmObjList *pos_lst;
  vm_obj_id_t pos_lst_id;
  vm_val_t tok_obj_val;
  CVmObjList *tok_lst;
  vm_obj_id_t tok_lst_id;
  vm_val_t alt_obj_val;
  vmgram_tok_info *tokp;
  size_t j;
  vmgram_alt_info **altp;
  size_t i;
  CVmObjList *alt_lst;
  vm_obj_id_t alt_lst_id;
  vm_val_t *in_stack_ffffffffffffff18;
  CVmStack *in_stack_ffffffffffffff20;
  vm_val_t *in_stack_ffffffffffffff28;
  char *str;
  vm_val_t local_c8;
  ulong local_b8;
  vm_prop_id_t *local_b0;
  CVmObject *local_a8;
  vm_obj_id_t local_9c;
  vm_val_t local_98;
  CVmObject *local_88;
  vm_obj_id_t local_7c;
  vm_val_t local_78;
  vmgram_tok_info *local_68;
  ulong local_60;
  vmgram_alt_info **local_48;
  char *local_40;
  CVmObject *local_38;
  vm_obj_id_t local_2c;
  vm_val_t *local_20;
  
  local_20 = in_RDX;
  if ((getp_get_gram_info(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_gram_info(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_gram_info::desc,0);
    __cxa_guard_release(&getp_get_gram_info(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff28,(uint *)in_stack_ffffffffffffff20,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff18);
  if (iVar1 == 0) {
    iVar1 = CVmStack::check_space
                      (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    if (iVar1 == 0) {
      err_throw(0);
    }
    get_ext(in_RDI);
    local_2c = CVmObjList::create((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                  (size_t)in_stack_ffffffffffffff18);
    local_38 = vm_objp(0);
    CVmObjList::cons_clear((CVmObjList *)in_stack_ffffffffffffff20);
    pvVar3 = CVmStack::push();
    vm_val_t::set_obj(pvVar3,local_2c);
    local_40 = (char *)0x0;
    pvVar4 = get_ext(in_RDI);
    local_48 = pvVar4->alts_;
    while (str = local_40, pvVar4 = get_ext(in_RDI), str < (char *)pvVar4->alt_cnt_) {
      if (G_predef_X.gramprod_gram_alt_info == 0) {
        vm_val_t::set_nil(&local_78);
        CVmObjList::cons_set_element
                  ((CVmObjList *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                   (vm_val_t *)0x30228c);
      }
      else {
        local_7c = CVmObjList::create((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                      (size_t)in_stack_ffffffffffffff18);
        local_88 = vm_objp(0);
        CVmObjList::cons_clear((CVmObjList *)in_stack_ffffffffffffff20);
        pvVar3 = CVmStack::push();
        vm_val_t::set_obj(pvVar3,local_7c);
        local_60 = 0;
        local_68 = (*local_48)->toks;
        for (; local_60 < (*local_48)->tok_cnt; local_60 = local_60 + 1) {
          if (G_predef_X.gramprod_gram_alt_tok_info == 0) {
            vm_val_t::set_nil(&local_98);
            CVmObjList::cons_set_element
                      ((CVmObjList *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                       (vm_val_t *)0x302342);
          }
          else {
            in_stack_ffffffffffffff20 = (CVmStack *)(ulong)(local_68->typ - 1);
            switch(in_stack_ffffffffffffff20) {
            case (CVmStack *)0x0:
              pvVar3 = CVmStack::push();
              vm_val_t::set_obj(pvVar3,(local_68->typinfo).prod_obj);
              break;
            case (CVmStack *)0x1:
              pvVar3 = CVmStack::push();
              vm_val_t::set_propid(pvVar3,(local_68->typinfo).speech_prop);
              break;
            case (CVmStack *)0x2:
              in_stack_ffffffffffffff18 = CVmStack::push();
              vVar2 = CVmObjString::create
                                ((int)((ulong)in_RDI >> 0x20),str,(size_t)in_stack_ffffffffffffff20)
              ;
              vm_val_t::set_obj(in_stack_ffffffffffffff18,vVar2);
              break;
            case (CVmStack *)0x3:
              pvVar3 = CVmStack::push();
              vm_val_t::set_enum(pvVar3,(local_68->typinfo).toktyp_enum);
              break;
            case (CVmStack *)0x4:
              pvVar3 = CVmStack::push();
              vm_val_t::set_nil(pvVar3);
              break;
            case (CVmStack *)0x5:
              local_9c = CVmObjList::create(0,(size_t)in_stack_ffffffffffffff18);
              local_a8 = vm_objp(0);
              pvVar3 = CVmStack::push();
              vm_val_t::set_obj(pvVar3,local_9c);
              local_b8 = 0;
              local_b0 = (local_68->typinfo).nspeech.props;
              for (; local_b8 < (local_68->typinfo).nspeech.cnt; local_b8 = local_b8 + 1) {
                vm_val_t::set_propid(&local_c8,*local_b0);
                CVmObjList::cons_set_element
                          ((CVmObjList *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18
                           ,(vm_val_t *)0x30243e);
                local_b0 = local_b0 + 1;
              }
            }
            pvVar3 = CVmStack::push();
            vm_val_t::set_int(pvVar3,(uint)local_68->typ);
            if (local_68->prop == 0) {
              pvVar3 = CVmStack::push();
              vm_val_t::set_nil(pvVar3);
            }
            else {
              pvVar3 = CVmStack::push();
              vm_val_t::set_propid(pvVar3,local_68->prop);
            }
            pvVar3 = CVmStack::push();
            vm_val_t::set_obj(pvVar3,G_predef_X.gramprod_gram_alt_tok_info);
            vVar2 = CVmObjTads::create_from_stack
                              ((uchar **)in_stack_ffffffffffffff20,
                               (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            vm_val_t::set_obj(&local_98,vVar2);
            CVmObjList::cons_set_element
                      ((CVmObjList *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                       (vm_val_t *)0x302556);
          }
          local_68 = local_68 + 1;
        }
        pvVar3 = CVmStack::push();
        vm_val_t::set_obj(pvVar3,local_7c);
        pvVar3 = CVmStack::push();
        vm_val_t::set_obj(pvVar3,(*local_48)->proc_obj);
        pvVar3 = CVmStack::push();
        vm_val_t::set_int(pvVar3,(*local_48)->badness);
        pvVar3 = CVmStack::push();
        vm_val_t::set_int(pvVar3,(*local_48)->score);
        pvVar3 = CVmStack::push();
        vm_val_t::set_obj(pvVar3,G_predef_X.gramprod_gram_alt_info);
        vVar2 = CVmObjTads::create_from_stack
                          ((uchar **)in_stack_ffffffffffffff20,
                           (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        vm_val_t::set_obj(&local_78,vVar2);
        CVmObjList::cons_set_element
                  ((CVmObjList *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                   (vm_val_t *)0x30262f);
        CVmStack::discard();
      }
      local_40 = local_40 + 1;
      local_48 = local_48 + 1;
    }
    CVmStack::discard();
    vm_val_t::set_obj(local_20,local_2c);
  }
  return 1;
}

Assistant:

int CVmObjGramProd::getp_get_gram_info(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *argc)
{
    vm_obj_id_t alt_lst_id;
    CVmObjList *alt_lst;
    size_t i;
    vmgram_alt_info **altp;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /*
     *   This routine uses considerable extra stack in the course of its
     *   work, so check in advance that we have enough space to run.  
     */
    if (!G_stk->check_space(8))
        err_throw(VMERR_STACK_OVERFLOW);

    /* create a list to hold the rule alternatives */
    alt_lst_id = CVmObjList::create(vmg_ FALSE, get_ext()->alt_cnt_);
    alt_lst = (CVmObjList *)vm_objp(vmg_ alt_lst_id);
    alt_lst->cons_clear();

    /* push it onto the stack for protection from garbage collection */
    G_stk->push()->set_obj(alt_lst_id);

    /* create the rule-alternative descriptions */
    for (i = 0, altp = get_ext()->alts_ ; i < get_ext()->alt_cnt_ ;
         ++i, ++altp)
    {
        size_t j;
        vmgram_tok_info *tokp;
        vm_val_t alt_obj_val;
        vm_obj_id_t tok_lst_id;
        CVmObjList *tok_lst;

        /* 
         *   if our imported GrammarAltInfo class isn't defined, we can't
         *   provide rule-alternative information, so just fill in the list
         *   with a nil 
         */
        if (G_predef->gramprod_gram_alt_info == VM_INVALID_OBJ)
        {
            /* add a nil to the list */
            alt_obj_val.set_nil();
            alt_lst->cons_set_element(i, &alt_obj_val);

            /* done with this slot */
            continue;
        }

        /* create a list to hold the token descriptors */
        tok_lst_id = CVmObjList::create(vmg_ FALSE, (*altp)->tok_cnt);
        tok_lst = (CVmObjList *)vm_objp(vmg_ tok_lst_id);
        tok_lst->cons_clear();

        /* push this momentarily for gc protection */
        G_stk->push()->set_obj(tok_lst_id);

        /*
         *   Run through the tokens in the rule alternative, and build a list
         *   of token descriptor structures. 
         */
        for (j = 0, tokp = (*altp)->toks ; j < (*altp)->tok_cnt ; ++j, ++tokp)
        {
            vm_val_t tok_obj_val;

            /* 
             *   if our imported GrammarAltTokInfo class isn't defined, we
             *   can't provide token information, so just fill in the list
             *   with a nil 
             */
            if (G_predef->gramprod_gram_alt_tok_info == VM_INVALID_OBJ)
            {
                /* add a nil to the list */
                tok_obj_val.set_nil();
                tok_lst->cons_set_element(j, &tok_obj_val);

                /* done with this slot */
                continue;
            }
            
            /* 
             *   The constructor arguments are the target property ID, the
             *   token type code, and extra information that depends on the
             *   type code.  We have to push the arguments backwards per the
             *   normal protocol, so start with the variant part.  
             */
            switch (tokp->typ)
            {
            case VMGRAM_MATCH_PROD:
                /* the extra information is the sub-production object */
                G_stk->push()->set_obj(tokp->typinfo.prod_obj);
                break;

            case VMGRAM_MATCH_SPEECH:
                /* the extra info is the part-of-speech property */
                G_stk->push()->set_propid(tokp->typinfo.speech_prop);
                break;

            case VMGRAM_MATCH_NSPEECH:
                /* the extra info is a list of part-of-speech properties */
                {
                    vm_obj_id_t pos_lst_id;
                    CVmObjList *pos_lst;
                    vm_prop_id_t *pp;
                    size_t k;

                    /* create the property list */
                    pos_lst_id = CVmObjList::create(
                        vmg_ FALSE, tokp->typinfo.nspeech.cnt);
                    pos_lst = (CVmObjList *)vm_objp(vmg_ pos_lst_id);

                    /* push it */
                    G_stk->push()->set_obj(pos_lst_id);

                    /* populate it */
                    for (k = 0, pp = tokp->typinfo.nspeech.props ;
                         k < tokp->typinfo.nspeech.cnt ;
                         ++k, ++pp)
                    {
                        vm_val_t val;
                        
                        /* fill in this element */
                        val.set_propid(*pp);
                        pos_lst->cons_set_element(k, &val);
                    }
                }
                break;

            case VMGRAM_MATCH_LITERAL:
                /* the extra info is the literal string value */
                G_stk->push()->set_obj(CVmObjString::create(
                    vmg_ FALSE, tokp->typinfo.lit.str,
                    tokp->typinfo.lit.len));
                break;

            case VMGRAM_MATCH_TOKTYPE:
                /* the extra information is the token class enum */
                G_stk->push()->set_enum(tokp->typinfo.toktyp_enum);
                break;

            case VMGRAM_MATCH_STAR:
                /* 
                 *   for a 'star' type, there is no extra information, but
                 *   push nil to keep the argument list uniform 
                 */
                G_stk->push()->set_nil();
                break;

            default:
                assert(FALSE);
                break;
            }

            /* now push the target property and type code */
            G_stk->push()->set_int(tokp->typ);
            if (tokp->prop != VM_INVALID_PROP)
                G_stk->push()->set_propid(tokp->prop);
            else
                G_stk->push()->set_nil();

            /* 
             *   the first argument to the constructor is the base class,
             *   which is the imported GrammarAltTokInfo class object 
             */
            G_stk->push()->set_obj(G_predef->gramprod_gram_alt_tok_info);

            /* create the object, at long last */
            tok_obj_val.set_obj(CVmObjTads::create_from_stack(vmg_ 0, 4));

            /* add it to our token list */
            tok_lst->cons_set_element(j, &tok_obj_val);
        }

        /* 
         *   Create the GrammarAltInfo object to desribe the alternative.
         *   Pass in the score, badness, match object, and token list as
         *   arguments to the constructor, which we'll count on to stash the
         *   information away in the new object.
         *   
         *   Note that the first constructor argument is the superclass,
         *   which is the imported GrammarAltInfo class object.  
         */
        G_stk->push()->set_obj(tok_lst_id);
        G_stk->push()->set_obj((*altp)->proc_obj);
        G_stk->push()->set_int((*altp)->badness);
        G_stk->push()->set_int((*altp)->score);
        G_stk->push()->set_obj(G_predef->gramprod_gram_alt_info);
        alt_obj_val.set_obj(CVmObjTads::create_from_stack(vmg_ 0, 5));

        /* add the new GrammarAltInfo to the main alternative list */
        alt_lst->cons_set_element(i, &alt_obj_val);

        /* 
         *   It's safe to discard the gc protection for the token list now,
         *   since a reference to is now stashed away in the GrammarAltInfo
         *   object, which in turn is referenced from our main alternative
         *   list, which we stashed on the stack earlier for gc protection.  
         */
        G_stk->discard();
    }

    /* it's safe to discard our gc protection for the main list now */
    G_stk->discard();

    /* return the main list */
    retval->set_obj(alt_lst_id);

    /* successful evaluation */
    return TRUE;
}